

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O0

EStatusCode __thiscall CFFPrimitiveReader::Read4ByteSigned(CFFPrimitiveReader *this,long *outValue)

{
  EStatusCode EVar1;
  int iStack_28;
  EStatusCode status;
  unsigned_long buffer;
  long *outValue_local;
  CFFPrimitiveReader *this_local;
  
  buffer = (unsigned_long)outValue;
  outValue_local = (long *)this;
  EVar1 = Read4ByteUnsigned(this,(unsigned_long *)&iStack_28);
  if (EVar1 == eSuccess) {
    *(long *)buffer = (long)iStack_28;
    this_local._4_4_ = eSuccess;
  }
  else {
    this_local._4_4_ = eFailure;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode CFFPrimitiveReader::Read4ByteSigned(long& outValue)
{
	unsigned long buffer;
	EStatusCode status = Read4ByteUnsigned(buffer);

	if(status != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	outValue = (int)buffer; // very important to cast to 32, to get the sign right

	return PDFHummus::eSuccess;
}